

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

void __thiscall QTemporaryFilePrivate::materializeUnnamedFile(QTemporaryFilePrivate *this)

{
  QAbstractFileEngine *pQVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_QFilePrivate).fileName.d.size == 0) &&
     (pQVar1 = (this->super_QFilePrivate).super_QFileDevicePrivate.fileEngine._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
     pQVar1 != (QAbstractFileEngine *)0x0)) {
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(&local_38,pQVar1,0);
    data = &((this->super_QFilePrivate).fileName.d.d)->super_QArrayData;
    pcVar2 = (this->super_QFilePrivate).fileName.d.ptr;
    (this->super_QFilePrivate).fileName.d.d = (Data *)local_38;
    (this->super_QFilePrivate).fileName.d.ptr = pcStack_30;
    qVar3 = (this->super_QFilePrivate).fileName.d.size;
    (this->super_QFilePrivate).fileName.d.size = local_28;
    local_38 = data;
    pcStack_30 = pcVar2;
    local_28 = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTemporaryFilePrivate::materializeUnnamedFile()
{
#ifdef LINUX_UNNAMED_TMPFILE
    if (!fileName.isEmpty() || !fileEngine)
        return;

    auto *tef = static_cast<QTemporaryFileEngine *>(fileEngine.get());
    fileName = tef->fileName(QAbstractFileEngine::DefaultName);
#endif
}